

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *palVar11;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  __m128i *ptr_02;
  ulong uVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  bool bVar36;
  longlong lVar37;
  ulong uVar38;
  ulong uVar40;
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i_64_t A;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i_64_t B;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long lVar49;
  __m128i_64_t B_3;
  long lVar52;
  undefined1 auVar51 [16];
  long lVar53;
  long lVar54;
  __m128i_64_t e;
  __m128i_64_t h;
  int local_114;
  ulong local_108;
  longlong local_58 [5];
  int64_t iVar50;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_sse2_128_64_cold_1();
        }
        else {
          iVar7 = uVar2 - 1;
          uVar22 = (ulong)uVar2 + 1 >> 1;
          uVar21 = (uint)uVar22;
          iVar8 = iVar7 / (int)uVar21;
          uVar16 = iVar7 % (int)uVar21;
          uVar28 = (ulong)(uint)open;
          iVar34 = -open;
          iVar13 = ppVar4->min;
          uVar35 = 0x8000000000000000 - (long)iVar13;
          if (iVar13 != iVar34 && SBORROW4(iVar13,iVar34) == iVar13 + open < 0) {
            uVar35 = uVar28 | 0x8000000000000000;
          }
          iVar13 = ppVar4->max;
          ppVar10 = parasail_result_new();
          if (ppVar10 == (parasail_result_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          ppVar10->flag =
               (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
               (uint)(s2_end != 0) << 0xf | ppVar10->flag | 0x2800802;
          palVar11 = parasail_memalign___m128i(0x10,uVar22);
          ptr = parasail_memalign___m128i(0x10,uVar22);
          ptr_00 = parasail_memalign___m128i(0x10,uVar22);
          ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
          if ((ptr_01 != (int64_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
              (ptr != (__m128i *)0x0 && palVar11 != (__m128i *)0x0)) {
            iVar9 = s2Len + -1;
            uVar38 = (ulong)(uint)gap;
            local_108 = uVar35 + 1;
            lVar18 = 0x7ffffffffffffffe - (long)iVar13;
            auVar41._8_4_ = (int)local_108;
            auVar41._0_8_ = local_108;
            auVar41._12_4_ = (int)(local_108 >> 0x20);
            auVar44._8_4_ = (int)lVar18;
            auVar44._0_8_ = lVar18;
            auVar44._12_4_ = (int)((ulong)lVar18 >> 0x20);
            auVar43._8_8_ = -(ulong)(iVar8 == 1);
            auVar43._0_8_ = -(ulong)(iVar8 == 0);
            lVar14 = (long)iVar34;
            uVar23 = 0;
            do {
              lVar30 = 0;
              lVar26 = lVar14;
              do {
                lVar15 = lVar26;
                if (s1_beg != 0) {
                  lVar15 = 0;
                }
                local_58[lVar30 + 2] = lVar15;
                local_58[lVar30] = lVar15 - uVar28;
                lVar30 = lVar30 + 1;
                lVar26 = lVar26 - uVar22 * (uint)gap;
              } while (lVar30 == 1);
              palVar11[uVar23][0] = local_58[2];
              palVar11[uVar23][1] = local_58[3];
              ptr_00[uVar23][0] = local_58[0];
              ptr_00[uVar23][1] = local_58[1];
              uVar23 = uVar23 + 1;
              lVar14 = lVar14 - (ulong)(uint)gap;
            } while (uVar23 != uVar22);
            *ptr_01 = 0;
            uVar23 = 1;
            iVar13 = iVar34;
            do {
              iVar17 = 0;
              if (s2_beg == 0) {
                iVar17 = iVar13;
              }
              ptr_01[uVar23] = (long)iVar17;
              uVar23 = uVar23 + 1;
              iVar13 = iVar13 - gap;
            } while (s2Len + 1 != uVar23);
            uVar23 = 1;
            if (1 < s2Len) {
              uVar23 = (ulong)(uint)s2Len;
            }
            lVar14 = (ulong)(uVar21 + (uVar21 == 0)) << 4;
            uVar25 = 0;
            auVar45 = auVar41;
            auVar46 = auVar41;
            local_114 = iVar9;
            do {
              ptr_02 = ptr;
              ptr = palVar11;
              iVar13 = ppVar4->mapper[(byte)s2[uVar25]];
              iVar50 = ptr_01[uVar25];
              lVar37 = ptr[uVar21 - 1][0];
              lVar26 = 0;
              auVar47 = auVar41;
              do {
                plVar1 = (long *)((long)pvVar3 + lVar26 + (long)iVar13 * (long)(int)uVar21 * 0x10);
                lVar49 = iVar50 + *plVar1;
                lVar52 = lVar37 + plVar1[1];
                lVar30 = *(long *)((long)*ptr_00 + lVar26);
                lVar15 = *(long *)((long)*ptr_00 + lVar26 + 8);
                if (lVar49 <= lVar30) {
                  lVar49 = lVar30;
                }
                if (lVar52 <= lVar15) {
                  lVar52 = lVar15;
                }
                lVar32 = auVar47._0_8_;
                if (lVar49 <= lVar32) {
                  lVar49 = lVar32;
                }
                lVar33 = auVar47._8_8_;
                if (lVar52 <= lVar33) {
                  lVar52 = lVar33;
                }
                lVar12 = auVar46._0_8_;
                if (auVar46._0_8_ <= lVar49) {
                  lVar12 = lVar49;
                }
                lVar19 = auVar46._8_8_;
                if (auVar46._8_8_ <= lVar52) {
                  lVar19 = lVar52;
                }
                lVar24 = lVar49;
                if (auVar44._0_8_ < lVar49) {
                  lVar24 = auVar44._0_8_;
                }
                lVar27 = lVar52;
                if (auVar44._8_8_ < lVar52) {
                  lVar27 = auVar44._8_8_;
                }
                plVar1 = (long *)((long)*ptr_00 + lVar26);
                lVar53 = *plVar1;
                lVar54 = plVar1[1];
                plVar1 = (long *)((long)*ptr_02 + lVar26);
                *plVar1 = lVar49;
                plVar1[1] = lVar52;
                if (lVar30 <= lVar24) {
                  lVar24 = lVar30;
                }
                if (lVar15 <= lVar27) {
                  lVar27 = lVar15;
                }
                auVar46._8_8_ = lVar19;
                auVar46._0_8_ = lVar12;
                if (lVar32 <= lVar24) {
                  lVar24 = lVar32;
                }
                if (lVar33 <= lVar27) {
                  lVar27 = lVar33;
                }
                lVar49 = lVar49 - uVar28;
                lVar52 = lVar52 - (ulong)(uint)open;
                lVar53 = lVar53 - uVar38;
                uVar40 = (ulong)(uint)gap;
                lVar54 = lVar54 - uVar40;
                if (lVar53 <= lVar49) {
                  lVar53 = lVar49;
                }
                auVar44._8_8_ = lVar27;
                auVar44._0_8_ = lVar24;
                if (lVar54 <= lVar52) {
                  lVar54 = lVar52;
                }
                if (lVar49 < (long)(lVar32 - uVar38)) {
                  lVar49 = lVar32 - uVar38;
                }
                plVar1 = (long *)((long)*ptr_00 + lVar26);
                *plVar1 = lVar53;
                plVar1[1] = lVar54;
                if (lVar52 < (long)(lVar33 - uVar40)) {
                  lVar52 = lVar33 - uVar40;
                }
                auVar47._8_8_ = lVar52;
                auVar47._0_8_ = lVar49;
                plVar1 = (long *)((long)*ptr + lVar26);
                iVar50 = *plVar1;
                lVar37 = plVar1[1];
                lVar26 = lVar26 + 0x10;
              } while (lVar14 != lVar26);
              iVar13 = 0;
              do {
                lVar26 = (long)iVar34;
                if (s2_beg == 0) {
                  lVar26 = ptr_01[uVar25 + 1] - uVar28;
                }
                auVar47._8_8_ = auVar47._0_8_;
                auVar47._0_8_ = lVar26;
                bVar36 = true;
                uVar20 = 1;
                lVar26 = 0;
                do {
                  lVar52 = auVar47._0_8_;
                  lVar30 = *(long *)((long)*ptr_02 + lVar26);
                  lVar15 = *(long *)((long)*ptr_02 + lVar26 + 8);
                  lVar49 = lVar52;
                  if (lVar52 < lVar30) {
                    lVar49 = lVar30;
                  }
                  lVar32 = auVar47._8_8_;
                  lVar30 = lVar32;
                  if (lVar32 < lVar15) {
                    lVar30 = lVar15;
                  }
                  plVar1 = (long *)((long)*ptr_02 + lVar26);
                  *plVar1 = lVar49;
                  plVar1[1] = lVar30;
                  lVar15 = auVar44._0_8_;
                  if (lVar49 <= auVar44._0_8_) {
                    lVar15 = lVar49;
                  }
                  lVar33 = auVar44._8_8_;
                  if (lVar30 <= auVar44._8_8_) {
                    lVar33 = lVar30;
                  }
                  auVar44._8_8_ = lVar33;
                  auVar44._0_8_ = lVar15;
                  lVar12 = lVar49;
                  if (lVar49 < auVar46._0_8_) {
                    lVar12 = auVar46._0_8_;
                  }
                  lVar19 = lVar30;
                  if (lVar30 < auVar46._8_8_) {
                    lVar19 = auVar46._8_8_;
                  }
                  auVar46._8_8_ = lVar19;
                  auVar46._0_8_ = lVar12;
                  auVar47._0_8_ = lVar52 - uVar38;
                  auVar47._8_8_ = lVar32 - uVar40;
                  uVar31 = -(ulong)((long)(lVar30 - (ulong)(uint)open) < auVar47._8_8_);
                  auVar51._8_8_ = uVar31;
                  auVar51._0_8_ = -(ulong)((long)(lVar49 - uVar28) < auVar47._0_8_);
                  if ((((((((((((((((auVar51 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar51 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar51 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar51 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar51 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar51 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar51 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar51 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (uVar31 >> 7 & 1) == 0) && (uVar31 >> 0xf & 1) == 0) &&
                          (uVar31 >> 0x17 & 1) == 0) && (uVar31 >> 0x1f & 1) == 0) &&
                        (uVar31 >> 0x27 & 1) == 0) && (uVar31 >> 0x2f & 1) == 0) &&
                      (uVar31 >> 0x37 & 1) == 0) && -1 < (long)uVar31) break;
                  bVar36 = uVar20 < uVar22;
                  lVar26 = lVar26 + 0x10;
                  uVar20 = uVar20 + 1;
                } while (lVar14 != lVar26);
              } while ((!bVar36) && (bVar36 = iVar13 == 0, iVar13 = iVar13 + 1, bVar36));
              lVar30 = auVar45._0_8_;
              lVar26 = ptr_02[uVar16][0];
              uVar40 = ptr_02[uVar16][1];
              uVar31 = auVar45._8_8_;
              uVar20 = uVar31;
              if ((long)uVar31 < (long)uVar40) {
                uVar20 = uVar40;
              }
              lVar49 = lVar30;
              if (lVar30 < lVar26) {
                lVar49 = lVar26;
              }
              auVar48._8_8_ = -(ulong)((long)uVar31 < (long)uVar40);
              auVar48._0_8_ = -(ulong)(lVar30 < lVar26);
              auVar48 = auVar48 & auVar43;
              if ((((((((((((((((auVar48 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar48 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar48 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar48 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar48 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar48 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar48 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar48 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar48 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar48 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar48 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar48 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar48[0xf] < '\0') {
                local_114 = (int)uVar25;
              }
              auVar45._8_8_ = uVar20;
              auVar45._0_8_ = lVar49;
              uVar25 = uVar25 + 1;
              palVar11 = ptr_02;
              if (uVar25 == uVar23) {
                if ((s2_end != 0) && (local_108 = uVar20, iVar8 < 1)) {
                  do {
                    local_108 = auVar45._0_8_;
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = local_108;
                    auVar45 = auVar5 << 0x40;
                  } while (iVar8 < 0);
                }
                iVar13 = iVar7;
                if ((s1_end != 0) && (((ulong)uVar2 + 1 & 0x7ffffffe) != 0)) {
                  uVar28 = 0;
                  do {
                    uVar29 = 0;
                    if ((uVar28 & 1) != 0) {
                      uVar29 = uVar21;
                    }
                    iVar34 = uVar29 + ((uint)(uVar28 >> 1) & 0x7fffffff);
                    iVar17 = iVar13;
                    iVar6 = local_114;
                    uVar22 = local_108;
                    if ((iVar34 < (int)uVar2) &&
                       (uVar23 = (*ptr_02)[uVar28], iVar17 = iVar34, iVar6 = iVar9, uVar22 = uVar23,
                       (long)uVar23 <= (long)local_108)) {
                      if (iVar13 <= iVar34) {
                        iVar34 = iVar13;
                      }
                      if (local_114 != iVar9) {
                        iVar34 = iVar13;
                      }
                      iVar17 = iVar13;
                      iVar6 = local_114;
                      uVar22 = local_108;
                      if (uVar23 == local_108) {
                        iVar17 = iVar34;
                      }
                    }
                    local_108 = uVar22;
                    local_114 = iVar6;
                    iVar13 = iVar17;
                    uVar28 = uVar28 + 1;
                  } while ((uVar21 & 0x3fffffff) * 2 != (int)uVar28);
                }
                if (s2_end == 0 && s1_end == 0) {
                  lVar37 = ptr_02[uVar16][0];
                  local_108._0_4_ = (int)ptr_02[uVar16][1];
                  iVar13 = iVar7;
                  local_114 = iVar9;
                  if (iVar8 < 1) {
                    do {
                      local_108._0_4_ = (int)lVar37;
                      lVar37 = 0;
                    } while (iVar8 < 0);
                  }
                }
                auVar39._8_8_ = -(ulong)(lVar33 <= (long)uVar35);
                auVar39._0_8_ = -(ulong)(lVar15 <= (long)uVar35);
                auVar42._8_8_ = -(ulong)(lVar18 < lVar19);
                auVar42._0_8_ = -(ulong)(lVar18 < lVar12);
                auVar42 = auVar42 | auVar39;
                if ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar42 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar42 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar42 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar42 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar42[0xf] < '\0') {
                  *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                  local_108._0_4_ = 0;
                  local_114 = 0;
                  iVar13 = 0;
                }
                ppVar10->score = (int)local_108;
                ppVar10->end_query = iVar13;
                ppVar10->end_ref = local_114;
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                parasail_free(ptr_02);
                return ppVar10;
              }
            } while( true );
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64_rpl(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}